

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O1

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 __thiscall
duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileInitGlobal
          (MultiFileFunction<duckdb::ParquetMultiFileInfo> *this,ClientContext *context,
          TableFunctionInitInput *input)

{
  vector<duckdb::ColumnIndex,_true> *__x;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  MultiFileBindData *data;
  pointer pMVar2;
  pointer pMVar3;
  _Head_base<0UL,_duckdb::MultiFileReaderGlobalState_*,_false> _Var4;
  pointer psVar5;
  TableFilterSet *pTVar6;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> _Var7;
  pointer puVar8;
  optional_ptr<duckdb::TableFilterSet,_true> table_filters;
  ulong uVar9;
  pointer puVar10;
  pointer puVar11;
  size_t __n;
  pointer pCVar12;
  __node_base_ptr p_Var13;
  _Hash_node_base *p_Var14;
  pointer pLVar15;
  unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
  uVar16;
  _Alloc_hider _Var17;
  bool bVar18;
  int32_t val;
  int iVar19;
  ReaderInitializeType RVar20;
  unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
  this_00;
  type pMVar21;
  pointer pMVar22;
  pointer pMVar23;
  MultiFileReaderData *pMVar24;
  undefined4 extraout_var;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> _Var25;
  TaskScheduler *this_01;
  unsigned_long uVar26;
  pointer pMVar27;
  BaseUnionData *pBVar28;
  BaseFileReader *pBVar29;
  type reader_data;
  MultiFileList *pMVar30;
  idx_t iVar31;
  pointer pMVar32;
  reference pvVar33;
  const_reference __x_00;
  __node_base_ptr p_Var34;
  InternalException *pIVar35;
  ulong uVar36;
  LogicalType *column_type;
  pointer puVar37;
  size_type __n_00;
  pointer pLVar38;
  MultiFileBindData *global_state;
  __uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
  _Var39;
  __node_base_ptr p_Var40;
  vector<duckdb::MultiFileColumnDefinition,_true> *pvVar41;
  __hash_code __code;
  pointer psVar42;
  pointer pCVar43;
  _Hash_node_base *p_Var44;
  bool bVar45;
  unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
  result;
  vector<duckdb::LogicalType,_true> table_types;
  unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>,_true> new_list;
  OpenFileInfo file_name;
  optional_idx max_threads;
  optional_idx local_38;
  
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&input->bind_data);
  data = (MultiFileBindData *)(input->bind_data).ptr;
  result.
  super_unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
  .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl =
       (unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
       )(__uniq_ptr_data<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true,_true>
         )0x0;
  MultiFileFilterPushdown
            ((MultiFileFunction<duckdb::ParquetMultiFileInfo> *)&new_list,context,data,
             &input->column_ids,(input->filters).ptr);
  if (new_list.super_unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>.
      _M_t.super___uniq_ptr_impl<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::MultiFileList_*,_std::default_delete<duckdb::MultiFileList>_>.
      super__Head_base<0UL,_duckdb::MultiFileList_*,_false>._M_head_impl ==
      (__uniq_ptr_data<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>,_true,_true>
       )0x0) {
    pMVar21 = shared_ptr<duckdb::MultiFileList,_true>::operator*(&data->file_list);
    this_00._M_t.
    super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
    .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true,_true>
          )operator_new(0xe8);
    *(undefined ***)
     this_00._M_t.
     super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
     ._M_t.
     super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
     .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl =
         &PTR__MultiFileGlobalState_024958f8;
    *(type *)((long)this_00._M_t.
                    super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
                    .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 8)
         = pMVar21;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 0x10) =
         0xffffffffffffffff;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 0x18) = 0;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 0x20) = 0;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 0x28) = 0;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 0x30) = 0;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 0x38) = 0;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 0x40) = 0;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 0x41) = 0;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 0x49) = 0;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 0x60) = 0;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 0x68) = 0;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 0x70) = 0;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 0x78) = 0;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 0x80) = 0;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 0x88) = 1;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 0x90) = 0;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 0x98) = 0;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 0xa0) = 0;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 0xa8) = 0;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 0xb0) = 0;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 0xb8) = 0;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 0xc0) = 0;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 200) = 0;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 0xd0) = 0;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 0xd8) = 0;
    *(undefined8 *)
     ((long)this_00._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl + 0xe0) = 0;
    _Var39._M_t.
    super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
    .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl =
         (tuple<duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>)
         (tuple<duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>)
         result;
  }
  else {
    this_00._M_t.
    super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
    .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true,_true>
          )operator_new(0xe8);
    file_name.path._M_dataplus._M_p =
         (pointer)new_list.
                  super_unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::MultiFileList_*,_std::default_delete<duckdb::MultiFileList>_>
                  .super__Head_base<0UL,_duckdb::MultiFileList_*,_false>._M_head_impl;
    new_list.super_unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>.
    _M_t.super___uniq_ptr_impl<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::MultiFileList_*,_std::default_delete<duckdb::MultiFileList>_>.
    super__Head_base<0UL,_duckdb::MultiFileList_*,_false>._M_head_impl =
         (unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>)
         (__uniq_ptr_data<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>,_true,_true>
          )0x0;
    MultiFileGlobalState::MultiFileGlobalState
              ((MultiFileGlobalState *)
               this_00._M_t.
               super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
               .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl,
               (unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>,_true>
                *)&file_name);
    _Var39._M_t.
    super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
    .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl =
         (tuple<duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>)
         (tuple<duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>)
         result;
    if (file_name.path._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)file_name.path._M_dataplus._M_p + 8))();
      _Var39._M_t.
      super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
      .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl =
           (tuple<duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
            )(tuple<duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
              )result;
    }
  }
  result.
  super_unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
  .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl =
       (unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
       )(unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
         )this_00._M_t.
          super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
          .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl;
  if ((__uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
       )_Var39._M_t.
        super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
        .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
       )0x0) {
    (**(code **)(*(long *)_Var39._M_t.
                          super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
                          .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl
                + 8))();
  }
  pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->(&result);
  pMVar30 = pMVar22->file_list;
  pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->(&result);
  MultiFileList::InitializeScan(pMVar30,&pMVar22->file_list_scan);
  pMVar2 = (data->reader_bind).schema.
           super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
           .
           super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar3 = (data->reader_bind).schema.
           super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
           .
           super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pMVar23 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
            ::operator->(&data->multi_file_reader);
  pvVar41 = &(data->reader_bind).schema;
  if (pMVar2 == pMVar3) {
    pvVar41 = &data->columns;
  }
  __x = &input->column_indexes;
  (*pMVar23->_vptr_MultiFileReader[9])
            (&file_name,pMVar23,context,&data->file_options,&data->reader_bind,pMVar30,pvVar41,__x);
  pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->(&result);
  _Var17 = file_name.path._M_dataplus;
  file_name.path._M_dataplus._M_p = (pointer)0x0;
  _Var4._M_head_impl =
       (pMVar22->multi_file_reader_state).
       super_unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::MultiFileReaderGlobalState_*,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
       .super__Head_base<0UL,_duckdb::MultiFileReaderGlobalState_*,_false>._M_head_impl;
  (pMVar22->multi_file_reader_state).
  super_unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::MultiFileReaderGlobalState_*,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
  .super__Head_base<0UL,_duckdb::MultiFileReaderGlobalState_*,_false>._M_head_impl =
       (MultiFileReaderGlobalState *)_Var17._M_p;
  if (_Var4._M_head_impl != (MultiFileReaderGlobalState *)0x0) {
    (**(code **)((long)(_Var4._M_head_impl)->_vptr_MultiFileReaderGlobalState + 8))();
  }
  if (file_name.path._M_dataplus._M_p != (pointer)0x0) {
    (**(code **)(*(long *)file_name.path._M_dataplus._M_p + 8))();
  }
  bVar18 = MultiFileList::IsEmpty(pMVar30);
  if (bVar18) {
    table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
              ::operator->(&result);
  }
  else {
    psVar42 = (data->union_readers).
              super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
              .
              super__Vector_base<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar5 = (data->union_readers).
             super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
             .
             super__Vector_base<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar42 == psVar5) {
      if ((data->initial_reader).internal.
          super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        pBVar29 = shared_ptr<duckdb::BaseFileReader,_true>::operator->(&data->initial_reader);
        MultiFileList::GetFirstFile(&file_name,pMVar30);
        __n = (pBVar29->file).path._M_string_length;
        if (__n == file_name.path._M_string_length) {
          if (__n == 0) {
            bVar18 = true;
          }
          else {
            iVar19 = bcmp((pBVar29->file).path._M_dataplus._M_p,file_name.path._M_dataplus._M_p,__n)
            ;
            bVar18 = iVar19 == 0;
          }
        }
        else {
          bVar18 = false;
        }
        if (file_name.extended_info.internal.
            super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     file_name.extended_info.internal.
                     super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)file_name.path._M_dataplus._M_p != &file_name.path.field_2) {
          operator_delete(file_name.path._M_dataplus._M_p);
        }
        if (bVar18) {
          pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                    ::operator->(&result);
          pMVar24 = (MultiFileReaderData *)operator_new(0xa0);
          file_name.path._M_dataplus._M_p =
               (pointer)(data->initial_reader).internal.
                        super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
          file_name.path._M_string_length =
               (size_type)
               (data->initial_reader).internal.
               super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
          (data->initial_reader).internal.
          super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (data->initial_reader).internal.
          super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          MultiFileReaderData::MultiFileReaderData
                    (pMVar24,(shared_ptr<duckdb::BaseFileReader,_true> *)&file_name);
          table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pMVar24;
          if (file_name.path._M_string_length != 0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       file_name.path._M_string_length);
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>,std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>,std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>>>
                      *)&pMVar22->readers,
                     (unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                      *)&table_types);
          pLVar38 = table_types.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            MultiFileReaderData::~MultiFileReaderData
                      ((MultiFileReaderData *)
                       table_types.
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start);
            operator_delete(pLVar38);
          }
        }
      }
      goto LAB_01b71ca2;
    }
    do {
      pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                ::operator->(&result);
      pMVar24 = (MultiFileReaderData *)operator_new(0xa0);
      file_name.path._M_dataplus._M_p =
           (pointer)(psVar42->internal).
                    super___shared_ptr<duckdb::BaseUnionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      file_name.path._M_string_length =
           (size_type)
           (psVar42->internal).super___shared_ptr<duckdb::BaseUnionData,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)file_name.path._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)file_name.path._M_string_length)->
          _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         file_name.path._M_string_length)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)file_name.path._M_string_length)->
          _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         file_name.path._M_string_length)->_M_use_count + 1;
        }
      }
      MultiFileReaderData::MultiFileReaderData
                (pMVar24,(shared_ptr<duckdb::BaseUnionData,_true> *)&file_name);
      table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pMVar24;
      if (file_name.path._M_string_length != 0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)file_name.path._M_string_length);
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>,std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>>
                ((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>,std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>>>
                  *)&pMVar22->readers,
                 (unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                  *)&table_types);
      pLVar38 = table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        MultiFileReaderData::~MultiFileReaderData
                  ((MultiFileReaderData *)
                   table_types.
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start);
        operator_delete(pLVar38);
      }
      psVar42 = psVar42 + 1;
    } while (psVar42 != psVar5);
    pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
              ::operator->(&result);
    puVar37 = (pMVar22->readers).
              super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar8 = (pMVar22->readers).
             super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    iVar19 = (*pMVar30->_vptr_MultiFileList[6])();
    if ((long)puVar8 - (long)puVar37 >> 3 == CONCAT44(extraout_var,iVar19)) goto LAB_01b71ca2;
    table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
              ::operator->(&result);
  }
  file_name.path._M_dataplus._M_p =
       (pointer)(pMVar22->readers).
                super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  file_name.path._M_string_length =
       (size_type)
       (pMVar22->readers).
       super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  file_name.path.field_2._M_allocated_capacity =
       (size_type)
       (pMVar22->readers).
       super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pMVar22->readers).
  super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start;
  (pMVar22->readers).
  super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  (pMVar22->readers).
  super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
             *)&file_name);
  ::std::
  vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
             *)&table_types);
LAB_01b71ca2:
  pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->(&result);
  LOCK();
  (pMVar22->file_index).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->(&result);
  global_state = (MultiFileBindData *)__x;
  ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::operator=
            (&(pMVar22->column_indexes).
              super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>,
             &__x->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
  pTVar6 = (input->filters).ptr;
  pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->(&result);
  (pMVar22->filters).ptr = pTVar6;
  unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
  ::operator*(&result);
  _Var25._M_head_impl = (GlobalTableFunctionState *)operator_new(0x18);
  (_Var25._M_head_impl)->_vptr_GlobalTableFunctionState = (_func_int **)0x0;
  _Var25._M_head_impl[1]._vptr_GlobalTableFunctionState = (_func_int **)0x0;
  _Var25._M_head_impl[2]._vptr_GlobalTableFunctionState = (_func_int **)0x0;
  (_Var25._M_head_impl)->_vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__GlobalTableFunctionState_024b5d90;
  pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->(&result);
  _Var7._M_head_impl =
       (pMVar22->global_state).
       super_unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
       .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl;
  (pMVar22->global_state).
  super_unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl =
       _Var25._M_head_impl;
  if (_Var7._M_head_impl != (GlobalTableFunctionState *)0x0) {
    (*(_Var7._M_head_impl)->_vptr_GlobalTableFunctionState[1])();
  }
  this_01 = TaskScheduler::GetScheduler(context);
  val = TaskScheduler::NumberOfThreads(this_01);
  uVar26 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
  pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->(&result);
  pMVar22->max_threads = uVar26;
  pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->(&result);
  puVar37 = (pMVar22->readers).
            super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar8 = (pMVar22->readers).
           super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar37 != puVar8) {
    paVar1 = &file_name.path.field_2;
    do {
      file_name.path._M_string_length = 0;
      file_name.path.field_2._M_allocated_capacity =
           file_name.path.field_2._M_allocated_capacity & 0xffffffffffffff00;
      file_name.extended_info.internal.
      super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      file_name.extended_info.internal.
      super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      file_name.path._M_dataplus._M_p = (pointer)paVar1;
      pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                ::operator->(&result);
      iVar31 = (pMVar22->file_list_scan).current_file_idx;
      pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                ::operator->(&result);
      global_state = (MultiFileBindData *)&pMVar22->file_list_scan;
      MultiFileList::Scan(pMVar30,(MultiFileListScanData *)global_state,&file_name);
      pMVar27 = unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                ::operator->(puVar37);
      if ((pMVar27->union_data).internal.
          super___shared_ptr<duckdb::BaseUnionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        pMVar27 = unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                  ::operator->(puVar37);
        pBVar29 = shared_ptr<duckdb::BaseFileReader,_true>::operator->(&pMVar27->reader);
        if ((file_name.path._M_string_length != (pBVar29->file).path._M_string_length) ||
           ((file_name.path._M_string_length != 0 &&
            (iVar19 = bcmp(file_name.path._M_dataplus._M_p,(pBVar29->file).path._M_dataplus._M_p,
                           file_name.path._M_string_length), iVar19 != 0)))) {
          pIVar35 = (InternalException *)__cxa_allocate_exception(0x10);
          table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&table_types.
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&table_types,
                     "Mismatch in filename order and reader order in multi file scan","");
          InternalException::InternalException(pIVar35,(string *)&table_types);
          __cxa_throw(pIVar35,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        reader_data = unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                      ::operator*(puVar37);
        table_filters.ptr = (input->filters).ptr;
        optional_idx::optional_idx(&local_38,iVar31);
        pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                  ::operator->(&result);
        global_state = data;
        RVar20 = InitializeReader(reader_data,data,__x,table_filters,context,local_38,
                                  (optional_ptr<duckdb::MultiFileReaderGlobalState,_true>)
                                  (pMVar22->multi_file_reader_state).
                                  super_unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_duckdb::MultiFileReaderGlobalState_*,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
                                  .
                                  super__Head_base<0UL,_duckdb::MultiFileReaderGlobalState_*,_false>
                                  ._M_head_impl);
        if (RVar20 == SKIP_READING_FILE) {
          pMVar27 = unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                    ::operator->(puVar37);
          pMVar27->file_state = SKIPPED;
          pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                    ::operator->(&result);
          LOCK();
          (pMVar22->file_index).super___atomic_base<unsigned_long>._M_i =
               (pMVar22->file_index).super___atomic_base<unsigned_long>._M_i + 1;
          UNLOCK();
        }
      }
      else {
        pMVar27 = unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                  ::operator->(puVar37);
        pBVar28 = shared_ptr<duckdb::BaseUnionData,_true>::operator->(&pMVar27->union_data);
        if (file_name.path._M_string_length != (pBVar28->file).path._M_string_length) {
LAB_01b72397:
          pIVar35 = (InternalException *)__cxa_allocate_exception(0x10);
          table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&table_types.
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&table_types,
                     "Mismatch in filename order and union reader order in multi file scan","");
          InternalException::InternalException(pIVar35,(string *)&table_types);
          __cxa_throw(pIVar35,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (file_name.path._M_string_length != 0) {
          global_state = (MultiFileBindData *)(pBVar28->file).path._M_dataplus._M_p;
          iVar19 = bcmp(file_name.path._M_dataplus._M_p,global_state,file_name.path._M_string_length
                       );
          if (iVar19 != 0) goto LAB_01b72397;
        }
      }
      if (file_name.extended_info.internal.
          super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   file_name.extended_info.internal.
                   super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)file_name.path._M_dataplus._M_p != paVar1) {
        operator_delete(file_name.path._M_dataplus._M_p);
      }
      puVar37 = puVar37 + 1;
    } while (puVar37 != puVar8);
  }
  pMVar30 = shared_ptr<duckdb::MultiFileList,_true>::operator->(&data->file_list);
  iVar19 = (*pMVar30->_vptr_MultiFileList[5])(pMVar30);
  unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
  ::operator*(&result);
  max_threads = ParquetMultiFileInfo::MaxThreads
                          (data,(MultiFileGlobalState *)global_state,(FileExpandResult)iVar19);
  if (max_threads.index != 0xffffffffffffffff) {
    pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
              ::operator->(&result);
    uVar9 = pMVar22->max_threads;
    iVar31 = optional_idx::GetIndex(&max_threads);
    pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
              ::operator->(&result);
    if (uVar9 < iVar31) {
      iVar31 = uVar9;
    }
    pMVar22->max_threads = iVar31;
  }
  pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->(&result);
  if ((pMVar22->multi_file_reader_state).
      super_unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::MultiFileReaderGlobalState_*,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
      .super__Head_base<0UL,_duckdb::MultiFileReaderGlobalState_*,_false>._M_head_impl ==
      (MultiFileReaderGlobalState *)0x0) {
    bVar18 = false;
  }
  else {
    pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
              ::operator->(&result);
    pMVar32 = unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>,_true>
              ::operator->(&pMVar22->multi_file_reader_state);
    bVar18 = (pMVar32->extra_columns).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start !=
             (pMVar32->extra_columns).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  puVar10 = (input->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar11 = (input->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (puVar10 == puVar11) {
    bVar45 = false;
  }
  else {
    bVar45 = (long)puVar11 - (long)puVar10 !=
             (long)(input->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(input->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
  }
  if ((bool)(bVar45 | bVar18)) {
    if (puVar10 ==
        (input->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                ::operator->(&result);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pMVar22->projection_ids,
                 (long)(input->column_indexes).
                       super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                       super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(input->column_indexes).
                       super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                       super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      if ((input->column_indexes).
          super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
          super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (input->column_indexes).
          super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
          super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
          super__Vector_impl_data._M_start) {
        __n_00 = 0;
        do {
          pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                    ::operator->(&result);
          pvVar33 = vector<unsigned_long,_true>::operator[](&pMVar22->projection_ids,__n_00);
          *pvVar33 = __n_00;
          __n_00 = __n_00 + 1;
        } while (__n_00 < (ulong)((long)(input->column_indexes).
                                        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                        .
                                        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(input->column_indexes).
                                        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                        .
                                        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
    }
    else {
      pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                ::operator->(&result);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pMVar22->projection_ids,
                 &(input->projection_ids).
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &(data->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    pCVar43 = (input->column_indexes).
              super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
              super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar12 = (input->column_indexes).
              super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
              super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pCVar43 != pCVar12) {
      do {
        p_Var44 = (_Hash_node_base *)pCVar43->index;
        if (p_Var44 < (_Hash_node_base *)0x8000000000000000) {
          pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                    ::operator->(&result);
          __x_00 = vector<duckdb::LogicalType,_true>::operator[](&table_types,(size_type)p_Var44);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    (&(pMVar22->scanned_types).
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__x_00
                    );
        }
        else {
          uVar9 = (data->virtual_columns)._M_h._M_bucket_count;
          uVar36 = (ulong)p_Var44 % uVar9;
          p_Var13 = (data->virtual_columns)._M_h._M_buckets[uVar36];
          p_Var34 = (__node_base_ptr)0x0;
          if ((p_Var13 != (__node_base_ptr)0x0) &&
             (p_Var34 = p_Var13, p_Var40 = p_Var13->_M_nxt, p_Var44 != p_Var13->_M_nxt[1]._M_nxt)) {
            while (p_Var14 = p_Var40->_M_nxt, p_Var14 != (_Hash_node_base *)0x0) {
              p_Var34 = (__node_base_ptr)0x0;
              if (((ulong)p_Var14[1]._M_nxt % uVar9 != uVar36) ||
                 (p_Var34 = p_Var40, p_Var40 = p_Var14, p_Var44 == p_Var14[1]._M_nxt))
              goto LAB_01b721e6;
            }
            p_Var34 = (__node_base_ptr)0x0;
          }
LAB_01b721e6:
          if (p_Var34 == (__node_base_ptr)0x0) {
            p_Var44 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var44 = p_Var34->_M_nxt;
          }
          if (p_Var44 == (_Hash_node_base *)0x0) {
            pIVar35 = (InternalException *)__cxa_allocate_exception(0x10);
            file_name.path._M_dataplus._M_p = (pointer)&file_name.path.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&file_name,"MultiFileReader - virtual column definition not found",
                       "");
            InternalException::InternalException(pIVar35,&file_name.path);
            __cxa_throw(pIVar35,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                    ::operator->(&result);
          ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
          emplace_back<duckdb::LogicalType&>
                    ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
                     &pMVar22->scanned_types,(LogicalType *)(p_Var44 + 6));
        }
        pCVar43 = pCVar43 + 1;
      } while (pCVar43 != pCVar12);
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
    ;
  }
  if (bVar18) {
    pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
              ::operator->(&result);
    pMVar32 = unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>,_true>
              ::operator->(&pMVar22->multi_file_reader_state);
    pLVar38 = (pMVar32->extra_columns).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start;
    pLVar15 = (pMVar32->extra_columns).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pLVar38 != pLVar15) {
      do {
        pMVar22 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                  ::operator->(&result);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&(pMVar22->scanned_types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,pLVar38)
        ;
        pLVar38 = pLVar38 + 1;
      } while (pLVar38 != pLVar15);
    }
  }
  uVar16.
  super_unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
  .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl =
       result.
       super_unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
       .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl;
  result.
  super_unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
  .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl =
       (unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
       )(__uniq_ptr_data<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true,_true>
         )0x0;
  (this->super_TableFunction).super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function
  ._vptr_Function =
       (_func_int **)
       uVar16.
       super_unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
       .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl;
  if (new_list.super_unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>.
      _M_t.super___uniq_ptr_impl<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::MultiFileList_*,_std::default_delete<duckdb::MultiFileList>_>.
      super__Head_base<0UL,_duckdb::MultiFileList_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)new_list.
                          super_unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::MultiFileList_*,_std::default_delete<duckdb::MultiFileList>_>
                          .super__Head_base<0UL,_duckdb::MultiFileList_*,_false>._M_head_impl + 8))
              ();
  }
  if (result.
      super_unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
      .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)result.
                          super_unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::MultiFileGlobalState_*,_std::default_delete<duckdb::MultiFileGlobalState>_>
                          .super__Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false>._M_head_impl
                + 8))();
  }
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )this;
}

Assistant:

static unique_ptr<GlobalTableFunctionState> MultiFileInitGlobal(ClientContext &context,
	                                                                TableFunctionInitInput &input) {
		auto &bind_data = input.bind_data->CastNoConst<MultiFileBindData>();
		unique_ptr<MultiFileGlobalState> result;

		// before instantiating a scan trigger a dynamic filter pushdown if possible
		auto new_list = MultiFileFilterPushdown(context, bind_data, input.column_ids, input.filters);
		if (new_list) {
			result = make_uniq<MultiFileGlobalState>(std::move(new_list));
		} else {
			result = make_uniq<MultiFileGlobalState>(*bind_data.file_list);
		}
		auto &file_list = result->file_list;
		file_list.InitializeScan(result->file_list_scan);

		auto &global_columns = bind_data.reader_bind.schema.empty() ? bind_data.columns : bind_data.reader_bind.schema;
		result->multi_file_reader_state = bind_data.multi_file_reader->InitializeGlobalState(
		    context, bind_data.file_options, bind_data.reader_bind, file_list, global_columns, input.column_indexes);

		if (file_list.IsEmpty()) {
			result->readers = {};
		} else if (!bind_data.union_readers.empty()) {
			for (auto &reader : bind_data.union_readers) {
				result->readers.push_back(make_uniq<MultiFileReaderData>(reader));
			}
			if (result->readers.size() != file_list.GetTotalFileCount()) {
				result->readers = {};
			}
		} else if (bind_data.initial_reader) {
			// we can only use the initial reader if it was constructed from the first file
			if (bind_data.initial_reader->GetFileName() == file_list.GetFirstFile().path) {
				result->readers.push_back(make_uniq<MultiFileReaderData>(std::move(bind_data.initial_reader)));
			}
		}

		result->file_index = 0;
		result->column_indexes = input.column_indexes;
		result->filters = input.filters.get();
		result->global_state = OP::InitializeGlobalState(context, bind_data, *result);
		result->max_threads = NumericCast<idx_t>(TaskScheduler::GetScheduler(context).NumberOfThreads());

		// Ensure all readers are initialized and FileListScan is sync with readers list
		for (auto &reader_data : result->readers) {
			OpenFileInfo file_name;
			idx_t file_idx = result->file_list_scan.current_file_idx;
			file_list.Scan(result->file_list_scan, file_name);
			if (reader_data->union_data) {
				if (file_name.path != reader_data->union_data->GetFileName()) {
					throw InternalException("Mismatch in filename order and union reader order in multi file scan");
				}
			} else {
				D_ASSERT(reader_data->reader);
				if (file_name.path != reader_data->reader->GetFileName()) {
					throw InternalException("Mismatch in filename order and reader order in multi file scan");
				}
				auto init_result = InitializeReader(*reader_data, bind_data, input.column_indexes, input.filters,
				                                    context, file_idx, result->multi_file_reader_state);
				if (init_result == ReaderInitializeType::SKIP_READING_FILE) {
					//! File can be skipped entirely, close it and move on
					reader_data->file_state = MultiFileFileState::SKIPPED;
					result->file_index++;
				}
			}
		}

		auto expand_result = bind_data.file_list->GetExpandResult();
		auto max_threads = OP::MaxThreads(bind_data, *result, expand_result);
		if (max_threads.IsValid()) {
			result->max_threads = MinValue<idx_t>(result->max_threads, max_threads.GetIndex());
		}
		bool require_extra_columns =
		    result->multi_file_reader_state && result->multi_file_reader_state->RequiresExtraColumns();
		if (input.CanRemoveFilterColumns() || require_extra_columns) {
			if (!input.projection_ids.empty()) {
				result->projection_ids = input.projection_ids;
			} else {
				result->projection_ids.resize(input.column_indexes.size());
				for (idx_t i = 0; i < input.column_indexes.size(); i++) {
					result->projection_ids[i] = i;
				}
			}

			const auto table_types = bind_data.types;
			for (const auto &col_idx : input.column_indexes) {
				auto column_id = col_idx.GetPrimaryIndex();
				if (col_idx.IsVirtualColumn()) {
					auto entry = bind_data.virtual_columns.find(column_id);
					if (entry == bind_data.virtual_columns.end()) {
						throw InternalException("MultiFileReader - virtual column definition not found");
					}
					result->scanned_types.emplace_back(entry->second.type);
				} else {
					result->scanned_types.push_back(table_types[column_id]);
				}
			}
		}
		if (require_extra_columns) {
			for (const auto &column_type : result->multi_file_reader_state->extra_columns) {
				result->scanned_types.push_back(column_type);
			}
		}
		return std::move(result);
	}